

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::ELU_x86_avx512::forward_inplace(ELU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ulong uVar12;
  int iVar13;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  ulong uVar14;
  undefined1 (*pauVar15) [64];
  int iVar16;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar17 [16];
  undefined1 auVar22 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 extraout_var [60];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float afVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float afVar48 [16];
  float afVar49 [16];
  float afVar50 [16];
  float afVar51 [16];
  float afVar52 [16];
  float afVar53 [16];
  float afVar54 [16];
  undefined1 in_ZMM20 [64];
  undefined1 auVar55 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar28 [32];
  
  iVar13 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  auVar30 = vbroadcastss_avx512f(ZEXT416(0x80000000));
  auVar31 = vxorps_avx512dq(auVar30,(undefined1  [64])::_ps512_cephes_exp_C1);
  auVar30 = vxorps_avx512dq(auVar30,(undefined1  [64])::_ps512_cephes_exp_C2);
  auVar32 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
  uVar14 = 0;
  uVar12 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar12 = uVar14;
  }
  auVar33 = vbroadcastss_avx512f(ZEXT416(0xbf800000));
  auVar17 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
  auVar55 = ZEXT1664(auVar17);
  auVar17 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
  auVar56 = ZEXT1664(auVar17);
  auVar22 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
  auVar57 = ZEXT3264(auVar22);
  auVar22 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
  auVar58 = ZEXT3264(auVar22);
  auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar59 = ZEXT3264(auVar22);
  auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
  auVar60 = ZEXT3264(auVar22);
  auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar62 = ZEXT3264(auVar22);
  auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
  auVar63 = ZEXT3264(auVar22);
  auVar22 = vbroadcastss_avx512vl(ZEXT416(0x395e8083));
  auVar64 = ZEXT3264(auVar22);
  auVar22 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
  auVar65 = ZEXT3264(auVar22);
  auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
  auVar66 = ZEXT3264(auVar22);
  auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
  auVar67 = ZEXT3264(auVar22);
  afVar45 = ::_ps512_1;
  afVar48 = ::_ps512_cephes_LOG2EF;
  afVar49 = ::_ps512_cephes_exp_p5;
  afVar50 = ::_ps512_cephes_exp_p0;
  afVar51 = ::_ps512_cephes_exp_p1;
  afVar52 = ::_ps512_cephes_exp_p2;
  afVar53 = ::_ps512_cephes_exp_p3;
  afVar54 = ::_ps512_cephes_exp_p4;
  for (; uVar14 != uVar12; uVar14 = uVar14 + 1) {
    pauVar15 = (undefined1 (*) [64])
               (bottom_top_blob->cstep * uVar14 * bottom_top_blob->elemsize +
               (long)bottom_top_blob->data);
    auVar34 = vbroadcastss_avx512f(ZEXT416((uint)(this->super_ELU).alpha));
    for (iVar16 = 0; iVar16 + 0xf < iVar13; iVar16 = iVar16 + 0x10) {
      auVar35 = vmaxps_avx512f(*pauVar15,auVar55);
      auVar36 = vminps_avx512f(*pauVar15,auVar55);
      auVar36 = vminps_avx512f(auVar36,(undefined1  [64])::_ps512_exp_hi);
      auVar36 = vmaxps_avx512f(auVar36,(undefined1  [64])::_ps512_exp_lo);
      auVar37 = vfmadd213ps_avx512f((undefined1  [64])afVar48,auVar36,(undefined1  [64])afVar49);
      auVar38 = vrndscaleps_avx512f(auVar37,1);
      uVar4 = vcmpps_avx512f(auVar37,auVar38,1);
      auVar37 = vsubps_avx512f(auVar38,(undefined1  [64])afVar45);
      bVar2 = (bool)((byte)uVar4 & 1);
      auVar39._0_4_ = (uint)bVar2 * auVar37._0_4_ | (uint)!bVar2 * auVar38._0_4_;
      bVar2 = (bool)((byte)(uVar4 >> 1) & 1);
      auVar39._4_4_ = (uint)bVar2 * auVar37._4_4_ | (uint)!bVar2 * auVar38._4_4_;
      bVar2 = (bool)((byte)(uVar4 >> 2) & 1);
      auVar39._8_4_ = (uint)bVar2 * auVar37._8_4_ | (uint)!bVar2 * auVar38._8_4_;
      bVar2 = (bool)((byte)(uVar4 >> 3) & 1);
      auVar39._12_4_ = (uint)bVar2 * auVar37._12_4_ | (uint)!bVar2 * auVar38._12_4_;
      bVar2 = (bool)((byte)(uVar4 >> 4) & 1);
      auVar39._16_4_ = (uint)bVar2 * auVar37._16_4_ | (uint)!bVar2 * auVar38._16_4_;
      bVar2 = (bool)((byte)(uVar4 >> 5) & 1);
      auVar39._20_4_ = (uint)bVar2 * auVar37._20_4_ | (uint)!bVar2 * auVar38._20_4_;
      bVar2 = (bool)((byte)(uVar4 >> 6) & 1);
      auVar39._24_4_ = (uint)bVar2 * auVar37._24_4_ | (uint)!bVar2 * auVar38._24_4_;
      bVar2 = (bool)((byte)(uVar4 >> 7) & 1);
      auVar39._28_4_ = (uint)bVar2 * auVar37._28_4_ | (uint)!bVar2 * auVar38._28_4_;
      bVar2 = (bool)((byte)(uVar4 >> 8) & 1);
      auVar39._32_4_ = (uint)bVar2 * auVar37._32_4_ | (uint)!bVar2 * auVar38._32_4_;
      bVar2 = (bool)((byte)(uVar4 >> 9) & 1);
      auVar39._36_4_ = (uint)bVar2 * auVar37._36_4_ | (uint)!bVar2 * auVar38._36_4_;
      bVar2 = (bool)((byte)(uVar4 >> 10) & 1);
      auVar39._40_4_ = (uint)bVar2 * auVar37._40_4_ | (uint)!bVar2 * auVar38._40_4_;
      bVar2 = (bool)((byte)(uVar4 >> 0xb) & 1);
      auVar39._44_4_ = (uint)bVar2 * auVar37._44_4_ | (uint)!bVar2 * auVar38._44_4_;
      bVar2 = (bool)((byte)(uVar4 >> 0xc) & 1);
      auVar39._48_4_ = (uint)bVar2 * auVar37._48_4_ | (uint)!bVar2 * auVar38._48_4_;
      bVar2 = (bool)((byte)(uVar4 >> 0xd) & 1);
      auVar39._52_4_ = (uint)bVar2 * auVar37._52_4_ | (uint)!bVar2 * auVar38._52_4_;
      bVar2 = (bool)((byte)(uVar4 >> 0xe) & 1);
      auVar39._56_4_ = (uint)bVar2 * auVar37._56_4_ | (uint)!bVar2 * auVar38._56_4_;
      bVar2 = SUB81(uVar4 >> 0xf,0);
      auVar39._60_4_ = (uint)bVar2 * auVar37._60_4_ | (uint)!bVar2 * auVar38._60_4_;
      auVar36 = vfmadd231ps_avx512f(auVar36,auVar39,auVar31);
      auVar36 = vfmadd231ps_avx512f(auVar36,auVar39,auVar30);
      auVar37 = vmulps_avx512f(auVar36,auVar36);
      auVar38 = vfmadd213ps_avx512f(auVar36,(undefined1  [64])afVar50,(undefined1  [64])afVar51);
      auVar38 = vfmadd213ps_avx512f(auVar38,auVar36,(undefined1  [64])afVar52);
      auVar38 = vfmadd213ps_avx512f(auVar38,auVar36,(undefined1  [64])afVar53);
      auVar38 = vfmadd213ps_avx512f(auVar38,auVar36,(undefined1  [64])afVar54);
      auVar38 = vfmadd213ps_avx512f(auVar38,auVar36,(undefined1  [64])afVar49);
      auVar36 = vfmadd213ps_avx512f(auVar38,auVar37,auVar36);
      auVar36 = vaddps_avx512f(auVar36,(undefined1  [64])afVar45);
      auVar37 = vcvttps2dq_avx512f(auVar39);
      auVar37 = vpaddd_avx512f(auVar32,auVar37);
      auVar37 = vpslld_avx512f(auVar37,0x17);
      auVar36 = vfmadd213ps_avx512f(auVar37,auVar36,auVar33);
      auVar35 = vfmadd213ps_avx512f(auVar36,auVar34,auVar35);
      *pauVar15 = auVar35;
      pauVar15 = pauVar15 + 1;
    }
    fVar1 = (this->super_ELU).alpha;
    auVar22._4_4_ = fVar1;
    auVar22._0_4_ = fVar1;
    auVar22._8_4_ = fVar1;
    auVar22._12_4_ = fVar1;
    auVar22._16_4_ = fVar1;
    auVar22._20_4_ = fVar1;
    auVar22._24_4_ = fVar1;
    auVar22._28_4_ = fVar1;
    for (; iVar16 + 7 < iVar13; iVar16 = iVar16 + 8) {
      auVar23 = vmaxps_avx512vl(*(undefined1 (*) [32])*pauVar15,auVar56._0_32_);
      auVar24 = vminps_avx512vl(*(undefined1 (*) [32])*pauVar15,auVar56._0_32_);
      auVar24 = vminps_avx512vl(auVar24,auVar57._0_32_);
      auVar25 = vmaxps_avx512vl(auVar24,auVar58._0_32_);
      auVar26 = vfmadd231ps_avx512vl(auVar59._0_32_,auVar25,auVar60._0_32_);
      auVar24 = vroundps_avx(auVar26,1);
      uVar4 = vcmpps_avx512vl(auVar26,auVar24,1);
      auVar61 = auVar62._0_32_;
      auVar27 = vsubps_avx512vl(auVar24,auVar61);
      bVar2 = (bool)((byte)uVar4 & 1);
      auVar28._0_4_ = (float)((uint)bVar2 * auVar27._0_4_ | (uint)!bVar2 * auVar24._0_4_);
      bVar2 = (bool)((byte)(uVar4 >> 1) & 1);
      auVar28._4_4_ = (float)((uint)bVar2 * auVar27._4_4_ | (uint)!bVar2 * auVar24._4_4_);
      bVar2 = (bool)((byte)(uVar4 >> 2) & 1);
      auVar28._8_4_ = (float)((uint)bVar2 * auVar27._8_4_ | (uint)!bVar2 * auVar24._8_4_);
      bVar2 = (bool)((byte)(uVar4 >> 3) & 1);
      auVar28._12_4_ = (float)((uint)bVar2 * auVar27._12_4_ | (uint)!bVar2 * auVar24._12_4_);
      bVar2 = (bool)((byte)(uVar4 >> 4) & 1);
      auVar28._16_4_ = (float)((uint)bVar2 * auVar27._16_4_ | (uint)!bVar2 * auVar24._16_4_);
      bVar2 = (bool)((byte)(uVar4 >> 5) & 1);
      auVar28._20_4_ = (float)((uint)bVar2 * auVar27._20_4_ | (uint)!bVar2 * auVar24._20_4_);
      bVar2 = (bool)((byte)(uVar4 >> 6) & 1);
      auVar28._24_4_ = (float)((uint)bVar2 * auVar27._24_4_ | (uint)!bVar2 * auVar24._24_4_);
      bVar2 = SUB81(uVar4 >> 7,0);
      auVar28._28_4_ = (float)((uint)bVar2 * auVar27._28_4_ | (uint)!bVar2 * auVar24._28_4_);
      auVar24 = vfmsub231ps_avx512vl(auVar25,auVar28,auVar63._0_32_);
      auVar29 = vfmsub231ps_avx512vl(auVar24,auVar28,auVar64._0_32_);
      auVar27._4_4_ = auVar29._4_4_ * auVar29._4_4_;
      auVar27._0_4_ = auVar29._0_4_ * auVar29._0_4_;
      auVar27._8_4_ = auVar29._8_4_ * auVar29._8_4_;
      auVar27._12_4_ = auVar29._12_4_ * auVar29._12_4_;
      auVar27._16_4_ = auVar29._16_4_ * auVar29._16_4_;
      auVar27._20_4_ = auVar29._20_4_ * auVar29._20_4_;
      auVar27._24_4_ = auVar29._24_4_ * auVar29._24_4_;
      auVar27._28_4_ = auVar26._28_4_;
      auVar24 = vfmadd213ps_avx512vl(auVar65._0_32_,auVar29,auVar66._0_32_);
      auVar25 = vfmadd213ps_avx512vl(auVar24,auVar29,auVar67._0_32_);
      auVar24._8_4_ = 0x3d2aa9c1;
      auVar24._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar24._12_4_ = 0x3d2aa9c1;
      auVar24._16_4_ = 0x3d2aa9c1;
      auVar24._20_4_ = 0x3d2aa9c1;
      auVar24._24_4_ = 0x3d2aa9c1;
      auVar24._28_4_ = 0x3d2aa9c1;
      auVar24 = vfmadd213ps_avx512vl(auVar25,auVar29,auVar24);
      auVar25._8_4_ = 0x3e2aaaaa;
      auVar25._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar25._12_4_ = 0x3e2aaaaa;
      auVar25._16_4_ = 0x3e2aaaaa;
      auVar25._20_4_ = 0x3e2aaaaa;
      auVar25._24_4_ = 0x3e2aaaaa;
      auVar25._28_4_ = 0x3e2aaaaa;
      auVar24 = vfmadd213ps_avx512vl(auVar24,auVar29,auVar25);
      auVar24 = vfmadd213ps_avx512vl(auVar24,auVar29,auVar59._0_32_);
      auVar17 = vfmadd213ps_fma(auVar24,auVar27,auVar29);
      auVar24 = vaddps_avx512vl(ZEXT1632(auVar17),auVar61);
      auVar29._0_4_ = (int)auVar28._0_4_;
      auVar29._4_4_ = (int)auVar28._4_4_;
      auVar29._8_4_ = (int)auVar28._8_4_;
      auVar29._12_4_ = (int)auVar28._12_4_;
      auVar29._16_4_ = (int)auVar28._16_4_;
      auVar29._20_4_ = (int)auVar28._20_4_;
      auVar29._24_4_ = (int)auVar28._24_4_;
      auVar29._28_4_ = (int)auVar28._28_4_;
      auVar25 = vpslld_avx2(auVar29,0x17);
      auVar26._8_4_ = 0x3f800000;
      auVar26._0_8_ = 0x3f8000003f800000;
      auVar26._12_4_ = 0x3f800000;
      auVar26._16_4_ = 0x3f800000;
      auVar26._20_4_ = 0x3f800000;
      auVar26._24_4_ = 0x3f800000;
      auVar26._28_4_ = 0x3f800000;
      auVar25 = vpaddd_avx512vl(auVar25,auVar26);
      auVar24 = vfmsub213ps_avx512vl(auVar25,auVar24,auVar61);
      auVar17 = vfmadd213ps_fma(auVar24,auVar22,auVar23);
      *(undefined1 (*) [32])*pauVar15 = ZEXT1632(auVar17);
      pauVar15 = (undefined1 (*) [64])(*pauVar15 + 0x20);
    }
    fVar1 = (this->super_ELU).alpha;
    auVar17._4_4_ = fVar1;
    auVar17._0_4_ = fVar1;
    auVar17._8_4_ = fVar1;
    auVar17._12_4_ = fVar1;
    for (; iVar16 + 3 < iVar13; iVar16 = iVar16 + 4) {
      auVar3 = vmaxps_avx(*(undefined1 (*) [16])*pauVar15,ZEXT816(0) << 0x40);
      auVar21 = vminps_avx(*(undefined1 (*) [16])*pauVar15,ZEXT816(0) << 0x40);
      auVar18._8_4_ = 0x42b0c0a5;
      auVar18._0_8_ = 0x42b0c0a542b0c0a5;
      auVar18._12_4_ = 0x42b0c0a5;
      auVar18 = vminps_avx512vl(auVar21,auVar18);
      auVar21._8_4_ = 0xc2b0c0a5;
      auVar21._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar21._12_4_ = 0xc2b0c0a5;
      auVar18 = vmaxps_avx512vl(auVar18,auVar21);
      auVar46._8_4_ = 0x3f000000;
      auVar46._0_8_ = 0x3f0000003f000000;
      auVar46._12_4_ = 0x3f000000;
      auVar19._8_4_ = 0x3fb8aa3b;
      auVar19._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar19._12_4_ = 0x3fb8aa3b;
      auVar19 = vfmadd231ps_avx512vl(auVar46,auVar18,auVar19);
      auVar43._0_4_ = (int)auVar19._0_4_;
      auVar43._4_4_ = (int)auVar19._4_4_;
      auVar43._8_4_ = (int)auVar19._8_4_;
      auVar43._12_4_ = (int)auVar19._12_4_;
      auVar21 = vcvtdq2ps_avx(auVar43);
      uVar4 = vcmpps_avx512vl(auVar19,auVar21,1);
      auVar47._8_4_ = 0x3f800000;
      auVar47._0_8_ = 0x3f8000003f800000;
      auVar47._12_4_ = 0x3f800000;
      auVar19 = vsubps_avx512vl(auVar21,auVar47);
      bVar2 = (bool)((byte)uVar4 & 1);
      auVar20._0_4_ = (float)((uint)bVar2 * auVar19._0_4_ | (uint)!bVar2 * auVar21._0_4_);
      bVar2 = (bool)((byte)(uVar4 >> 1) & 1);
      auVar20._4_4_ = (float)((uint)bVar2 * auVar19._4_4_ | (uint)!bVar2 * auVar21._4_4_);
      bVar2 = (bool)((byte)(uVar4 >> 2) & 1);
      auVar20._8_4_ = (float)((uint)bVar2 * auVar19._8_4_ | (uint)!bVar2 * auVar21._8_4_);
      bVar2 = (bool)((byte)(uVar4 >> 3) & 1);
      auVar20._12_4_ = (float)((uint)bVar2 * auVar19._12_4_ | (uint)!bVar2 * auVar21._12_4_);
      auVar5._8_4_ = 0x3f318000;
      auVar5._0_8_ = 0x3f3180003f318000;
      auVar5._12_4_ = 0x3f318000;
      auVar21 = vfmsub231ps_avx512vl(auVar18,auVar20,auVar5);
      auVar6._8_4_ = 0x395e8083;
      auVar6._0_8_ = 0x395e8083395e8083;
      auVar6._12_4_ = 0x395e8083;
      auVar18 = vfmsub231ps_avx512vl(auVar21,auVar20,auVar6);
      auVar41._0_4_ = auVar18._0_4_ * auVar18._0_4_;
      auVar41._4_4_ = auVar18._4_4_ * auVar18._4_4_;
      auVar41._8_4_ = auVar18._8_4_ * auVar18._8_4_;
      auVar41._12_4_ = auVar18._12_4_ * auVar18._12_4_;
      auVar44._8_4_ = 0x39506967;
      auVar44._0_8_ = 0x3950696739506967;
      auVar44._12_4_ = 0x39506967;
      auVar7._8_4_ = 0x3ab743ce;
      auVar7._0_8_ = 0x3ab743ce3ab743ce;
      auVar7._12_4_ = 0x3ab743ce;
      auVar21 = vfmadd213ps_avx512vl(auVar44,auVar18,auVar7);
      auVar8._8_4_ = 0x3c088908;
      auVar8._0_8_ = 0x3c0889083c088908;
      auVar8._12_4_ = 0x3c088908;
      auVar21 = vfmadd213ps_avx512vl(auVar21,auVar18,auVar8);
      auVar9._8_4_ = 0x3d2aa9c1;
      auVar9._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar9._12_4_ = 0x3d2aa9c1;
      auVar21 = vfmadd213ps_avx512vl(auVar21,auVar18,auVar9);
      auVar10._8_4_ = 0x3e2aaaaa;
      auVar10._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar10._12_4_ = 0x3e2aaaaa;
      auVar21 = vfmadd213ps_avx512vl(auVar21,auVar18,auVar10);
      auVar21 = vfmadd213ps_fma(auVar21,auVar18,auVar46);
      auVar21 = vfmadd213ps_fma(auVar21,auVar41,auVar18);
      auVar40._0_4_ = auVar21._0_4_ + 1.0;
      auVar40._4_4_ = auVar21._4_4_ + 1.0;
      auVar40._8_4_ = auVar21._8_4_ + 1.0;
      auVar40._12_4_ = auVar21._12_4_ + 1.0;
      auVar42._0_4_ = (int)auVar20._0_4_;
      auVar42._4_4_ = (int)auVar20._4_4_;
      auVar42._8_4_ = (int)auVar20._8_4_;
      auVar42._12_4_ = (int)auVar20._12_4_;
      auVar21 = vpslld_avx(auVar42,0x17);
      auVar11._8_4_ = 0x3f800000;
      auVar11._0_8_ = 0x3f8000003f800000;
      auVar11._12_4_ = 0x3f800000;
      auVar21 = vpaddd_avx512vl(auVar21,auVar11);
      auVar21 = vfmsub213ps_fma(auVar21,auVar40,auVar47);
      auVar21 = vfmadd213ps_fma(auVar21,auVar17,auVar3);
      *(undefined1 (*) [16])*pauVar15 = auVar21;
      pauVar15 = (undefined1 (*) [64])(*pauVar15 + 0x10);
    }
    while( true ) {
      auVar17 = auVar55._0_16_;
      auVar21 = auVar56._0_16_;
      if (iVar13 <= iVar16) break;
      if (*(float *)*pauVar15 < 0.0) {
        fVar1 = (this->super_ELU).alpha;
        auVar34._0_4_ = expf(*(float *)*pauVar15);
        afVar49 = ::_ps512_cephes_exp_p5;
        afVar54 = ::_ps512_cephes_exp_p4;
        afVar53 = ::_ps512_cephes_exp_p3;
        afVar52 = ::_ps512_cephes_exp_p2;
        afVar51 = ::_ps512_cephes_exp_p1;
        afVar50 = ::_ps512_cephes_exp_p0;
        afVar48 = ::_ps512_cephes_LOG2EF;
        afVar45 = ::_ps512_1;
        auVar34._4_60_ = extraout_var;
        auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar67 = ZEXT3264(auVar22);
        auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar66 = ZEXT3264(auVar22);
        auVar22 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar65 = ZEXT3264(auVar22);
        auVar22 = vbroadcastss_avx512vl(ZEXT416(0x395e8083));
        auVar64 = ZEXT3264(auVar22);
        auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        auVar63 = ZEXT3264(auVar22);
        auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar62 = ZEXT3264(auVar22);
        auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar60 = ZEXT3264(auVar22);
        auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar59 = ZEXT3264(auVar22);
        auVar22 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar58 = ZEXT3264(auVar22);
        auVar22 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar57 = ZEXT3264(auVar22);
        auVar21 = vxorps_avx512vl(auVar21,auVar21);
        auVar56 = ZEXT1664(auVar21);
        auVar17 = vxorps_avx512vl(auVar17,auVar17);
        auVar55 = ZEXT1664(auVar17);
        auVar33 = vbroadcastss_avx512f(ZEXT416(0xbf800000));
        auVar32 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar17 = ZEXT416((uint)fVar1);
        auVar17 = vfmsub213ss_fma(auVar34._0_16_,auVar17,auVar17);
        *(int *)*pauVar15 = auVar17._0_4_;
      }
      pauVar15 = (undefined1 (*) [64])(*pauVar15 + 4);
      iVar16 = iVar16 + 1;
    }
  }
  return 0;
}

Assistant:

int ELU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _mm512_storeu_ps(ptr, elu_avx512(_p, _alpha512));

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, elu_avx(_p, _alpha256));

            ptr += 8;
        }
#endif // __AVX__
        __m128 _alpha128 = _mm_set1_ps(alpha);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _mm_store_ps(ptr, elu_sse(_p, _alpha128));

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < 0.f)
                *ptr = alpha * (expf(*ptr) - 1.f);
            ptr++;
        }
    }

    return 0;
}